

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::new_line(basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this)

{
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int i;
  undefined7 in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff7f;
  string *length;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *s;
  int local_58;
  string local_48 [32];
  string local_28 [40];
  
  s = in_RDI + 2;
  length = local_28;
  basic_json_encode_options<char>::new_line_chars_abi_cxx11_
            ((basic_json_encode_options<char> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  this_00 = (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::__cxx11::string::data();
  basic_json_encode_options<char>::new_line_chars_abi_cxx11_
            ((basic_json_encode_options<char> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  std::__cxx11::string::length();
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  append(this_00,(value_type *)s,(size_t)length);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  for (local_58 = 0; local_58 < *(int *)&in_RDI[0x2e].buf_ptr; local_58 = local_58 + 1) {
    string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    push_back(in_RDI,in_stack_ffffffffffffff7f);
  }
  in_RDI[0x2f].buf_ptr = (container_type *)(long)*(int *)&in_RDI[0x2e].buf_ptr;
  return;
}

Assistant:

void new_line()
        {
            sink_.append(options_.new_line_chars().data(),options_.new_line_chars().length());
            for (int i = 0; i < indent_amount_; ++i)
            {
                sink_.push_back(' ');
            }
            column_ = indent_amount_;
        }